

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::ReLU_x86_avx512::forward_inplace_int8(ReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ushort uVar20;
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  
  uVar1 = bottom_top_blob->c;
  iVar13 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d;
  bVar3 = (this->super_ReLU).slope == 0.0;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar1 && bVar3) {
      uVar14 = 0;
      do {
        if (0 < iVar13) {
          pvVar2 = bottom_top_blob->data;
          lVar15 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar14;
          lVar16 = 0;
          do {
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 1) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 1) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 2) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 2) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 3) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 3) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 4) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 4) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 5) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 5) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 6) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 6) = 0;
            }
            if (*(char *)((long)pvVar2 + lVar16 * 8 + lVar15 + 7) < '\0') {
              *(undefined1 *)((long)pvVar2 + lVar16 * 8 + lVar15 + 7) = 0;
            }
            lVar16 = lVar16 + 1;
          } while (iVar13 != (int)lVar16);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar1);
    }
  }
  else if (0 < (int)uVar1 && bVar3) {
    auVar21 = vpbroadcastq_avx512f();
    uVar14 = 0;
    auVar22 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
    auVar25 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
    auVar26 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
    auVar27 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
    auVar28 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar29 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      if (0 < iVar13) {
        lVar15 = bottom_top_blob->cstep * bottom_top_blob->elemsize * uVar14;
        pvVar2 = bottom_top_blob->data;
        uVar17 = 0;
        do {
          auVar30 = vpbroadcastq_avx512f();
          auVar31 = vporq_avx512f(auVar30,auVar22);
          auVar32 = vporq_avx512f(auVar30,auVar23);
          auVar33 = vporq_avx512f(auVar30,auVar24);
          auVar34 = vporq_avx512f(auVar30,auVar25);
          auVar35 = vporq_avx512f(auVar30,auVar26);
          auVar36 = vporq_avx512f(auVar30,auVar27);
          auVar37 = vporq_avx512f(auVar30,auVar28);
          auVar30 = vporq_avx512f(auVar30,auVar29);
          uVar4 = vpcmpuq_avx512f(auVar30,auVar21,2);
          uVar5 = vpcmpuq_avx512f(auVar37,auVar21,2);
          uVar6 = vpcmpuq_avx512f(auVar36,auVar21,2);
          uVar7 = vpcmpuq_avx512f(auVar35,auVar21,2);
          uVar8 = vpcmpuq_avx512f(auVar34,auVar21,2);
          uVar9 = vpcmpuq_avx512f(auVar33,auVar21,2);
          uVar10 = vpcmpuq_avx512f(auVar32,auVar21,2);
          uVar11 = vpcmpuq_avx512f(auVar31,auVar21,2);
          bVar12 = (byte)uVar11;
          uVar20 = CONCAT11(bVar12,(byte)uVar10);
          uVar18 = CONCAT22(uVar20,CONCAT11((byte)uVar9,(byte)uVar8));
          uVar19 = CONCAT44(uVar18,CONCAT22(CONCAT11((byte)uVar7,(byte)uVar6),
                                            CONCAT11((byte)uVar5,(byte)uVar4)));
          auVar30 = vmovdqu8_avx512bw(*(undefined1 (*) [64])((long)pvVar2 + uVar17 + lVar15));
          auVar31[1] = ((byte)(uVar19 >> 1) & 1) * auVar30[1];
          auVar31[0] = ((byte)uVar4 & 1) * auVar30[0];
          auVar31[2] = ((byte)(uVar19 >> 2) & 1) * auVar30[2];
          auVar31[3] = ((byte)(uVar19 >> 3) & 1) * auVar30[3];
          auVar31[4] = ((byte)(uVar19 >> 4) & 1) * auVar30[4];
          auVar31[5] = ((byte)(uVar19 >> 5) & 1) * auVar30[5];
          auVar31[6] = ((byte)(uVar19 >> 6) & 1) * auVar30[6];
          auVar31[7] = ((byte)(uVar19 >> 7) & 1) * auVar30[7];
          auVar31[8] = ((byte)uVar5 & 1) * auVar30[8];
          auVar31[9] = ((byte)(uVar19 >> 9) & 1) * auVar30[9];
          auVar31[10] = ((byte)(uVar19 >> 10) & 1) * auVar30[10];
          auVar31[0xb] = ((byte)(uVar19 >> 0xb) & 1) * auVar30[0xb];
          auVar31[0xc] = ((byte)(uVar19 >> 0xc) & 1) * auVar30[0xc];
          auVar31[0xd] = ((byte)(uVar19 >> 0xd) & 1) * auVar30[0xd];
          auVar31[0xe] = ((byte)(uVar19 >> 0xe) & 1) * auVar30[0xe];
          auVar31[0xf] = ((byte)(uVar19 >> 0xf) & 1) * auVar30[0xf];
          auVar31[0x10] = ((byte)uVar6 & 1) * auVar30[0x10];
          auVar31[0x11] = ((byte)(uVar19 >> 0x11) & 1) * auVar30[0x11];
          auVar31[0x12] = ((byte)(uVar19 >> 0x12) & 1) * auVar30[0x12];
          auVar31[0x13] = ((byte)(uVar19 >> 0x13) & 1) * auVar30[0x13];
          auVar31[0x14] = ((byte)(uVar19 >> 0x14) & 1) * auVar30[0x14];
          auVar31[0x15] = ((byte)(uVar19 >> 0x15) & 1) * auVar30[0x15];
          auVar31[0x16] = ((byte)(uVar19 >> 0x16) & 1) * auVar30[0x16];
          auVar31[0x17] = ((byte)(uVar19 >> 0x17) & 1) * auVar30[0x17];
          auVar31[0x18] = ((byte)uVar7 & 1) * auVar30[0x18];
          auVar31[0x19] = ((byte)(uVar19 >> 0x19) & 1) * auVar30[0x19];
          auVar31[0x1a] = ((byte)(uVar19 >> 0x1a) & 1) * auVar30[0x1a];
          auVar31[0x1b] = ((byte)(uVar19 >> 0x1b) & 1) * auVar30[0x1b];
          auVar31[0x1c] = ((byte)(uVar19 >> 0x1c) & 1) * auVar30[0x1c];
          auVar31[0x1d] = ((byte)(uVar19 >> 0x1d) & 1) * auVar30[0x1d];
          auVar31[0x1e] = ((byte)(uVar19 >> 0x1e) & 1) * auVar30[0x1e];
          auVar31[0x1f] = ((byte)(uVar19 >> 0x1f) & 1) * auVar30[0x1f];
          auVar31[0x20] = ((byte)uVar8 & 1) * auVar30[0x20];
          auVar31[0x21] = ((byte)(uVar18 >> 1) & 1) * auVar30[0x21];
          auVar31[0x22] = ((byte)(uVar18 >> 2) & 1) * auVar30[0x22];
          auVar31[0x23] = ((byte)(uVar18 >> 3) & 1) * auVar30[0x23];
          auVar31[0x24] = ((byte)(uVar18 >> 4) & 1) * auVar30[0x24];
          auVar31[0x25] = ((byte)(uVar18 >> 5) & 1) * auVar30[0x25];
          auVar31[0x26] = ((byte)(uVar18 >> 6) & 1) * auVar30[0x26];
          auVar31[0x27] = ((byte)(uVar18 >> 7) & 1) * auVar30[0x27];
          auVar31[0x28] = ((byte)uVar9 & 1) * auVar30[0x28];
          auVar31[0x29] = ((byte)(uVar18 >> 9) & 1) * auVar30[0x29];
          auVar31[0x2a] = ((byte)(uVar18 >> 10) & 1) * auVar30[0x2a];
          auVar31[0x2b] = ((byte)(uVar18 >> 0xb) & 1) * auVar30[0x2b];
          auVar31[0x2c] = ((byte)(uVar18 >> 0xc) & 1) * auVar30[0x2c];
          auVar31[0x2d] = ((byte)(uVar18 >> 0xd) & 1) * auVar30[0x2d];
          auVar31[0x2e] = ((byte)(uVar18 >> 0xe) & 1) * auVar30[0x2e];
          auVar31[0x2f] = ((byte)(uVar18 >> 0xf) & 1) * auVar30[0x2f];
          auVar31[0x30] = ((byte)uVar10 & 1) * auVar30[0x30];
          auVar31[0x31] = ((byte)(uVar20 >> 1) & 1) * auVar30[0x31];
          auVar31[0x32] = ((byte)(uVar20 >> 2) & 1) * auVar30[0x32];
          auVar31[0x33] = ((byte)(uVar20 >> 3) & 1) * auVar30[0x33];
          auVar31[0x34] = ((byte)(uVar20 >> 4) & 1) * auVar30[0x34];
          auVar31[0x35] = ((byte)(uVar20 >> 5) & 1) * auVar30[0x35];
          auVar31[0x36] = ((byte)(uVar20 >> 6) & 1) * auVar30[0x36];
          auVar31[0x37] = ((byte)(uVar20 >> 7) & 1) * auVar30[0x37];
          auVar31[0x38] = (bVar12 & 1) * auVar30[0x38];
          auVar31[0x39] = (bVar12 >> 1 & 1) * auVar30[0x39];
          auVar31[0x3a] = (bVar12 >> 2 & 1) * auVar30[0x3a];
          auVar31[0x3b] = (bVar12 >> 3 & 1) * auVar30[0x3b];
          auVar31[0x3c] = (bVar12 >> 4 & 1) * auVar30[0x3c];
          auVar31[0x3d] = (bVar12 >> 5 & 1) * auVar30[0x3d];
          auVar31[0x3e] = (bVar12 >> 6 & 1) * auVar30[0x3e];
          auVar31[0x3f] = -((char)bVar12 >> 7) * auVar30[0x3f];
          vpcmpgtb_avx512bw(ZEXT1664((undefined1  [16])0x0),auVar31);
          auVar30 = vmovdqu8_avx512bw(ZEXT1664((undefined1  [16])0x0));
          *(undefined1 (*) [64])((long)pvVar2 + uVar17 + lVar15) = auVar30;
          uVar17 = uVar17 + 0x40;
        } while ((iVar13 + 0x3fU & 0xffffffc0) != uVar17);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar1);
  }
  return 0;
}

Assistant:

int ReLU_x86_avx512::forward_inplace_int8(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;
    int elempack = bottom_top_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (slope == 0.f)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                signed char* ptr = bottom_top_blob.channel(q);

                int i = 0;
                for (; i < size; i++)
                {
                    if (ptr[0] < 0)
                        ptr[0] = 0;
                    if (ptr[1] < 0)
                        ptr[1] = 0;
                    if (ptr[2] < 0)
                        ptr[2] = 0;
                    if (ptr[3] < 0)
                        ptr[3] = 0;
                    if (ptr[4] < 0)
                        ptr[4] = 0;
                    if (ptr[5] < 0)
                        ptr[5] = 0;
                    if (ptr[6] < 0)
                        ptr[6] = 0;
                    if (ptr[7] < 0)
                        ptr[7] = 0;

                    ptr += 8;
                }
            }
        }
        else
        {
            // TODO leakyrelu
        }

        return 0;
    }
#endif // __SSE2__

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            signed char* ptr = bottom_top_blob.channel(q);

            int i = 0;
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr = 0;

                ptr++;
            }
        }
    }
    else
    {
        // TODO leakyrelu
    }

    return 0;
}